

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O2

xmlChar * htmlFindEntityPrefix(xmlChar *string,size_t slen,int isAttr,int *nlen,int *rlen)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  bool bVar13;
  bool bVar14;
  ulong local_90;
  byte *local_88;
  
  if ((slen < 2) || (0x19 < (*string | 0x20) - 0x61)) {
    return (xmlChar *)0x0;
  }
  lVar2 = (ulong)(*string & 0x3f) * 3;
  uVar11 = (uint)*(ushort *)("" + lVar2);
  uVar6 = (uint)""[lVar2 + 2] + (uint)*(ushort *)("" + lVar2);
  uVar9 = 1;
  local_90 = 0;
  local_88 = (byte *)0x0;
  do {
    uVar5 = (ulong)uVar6;
    while( true ) {
      do {
        uVar7 = uVar5;
        uVar10 = (uint)uVar7;
        uVar6 = uVar10 - uVar11;
        if (uVar10 < uVar11 || uVar6 == 0) goto LAB_001645ce;
        uVar6 = (uVar6 >> 1) + uVar11;
        uVar4 = (ulong)htmlEntValues[uVar6];
        bVar1 = htmlEntStrings[uVar4];
        uVar12 = (ulong)(bVar1 & 0x3f);
        iVar3 = (uint)string[uVar9] - (uint)htmlEntStrings[uVar4 + 1];
        if (iVar3 == 0) {
          if (slen < uVar12) {
            iVar3 = strncmp((char *)(string + uVar9 + 1),(char *)(htmlEntStrings + uVar4 + 2),
                            slen - 1);
            if (iVar3 == 0) goto LAB_001645ce;
          }
          else {
            iVar3 = strncmp((char *)(string + uVar9 + 1),(char *)(htmlEntStrings + uVar4 + 2),
                            uVar12 - 1);
          }
        }
        uVar5 = (ulong)uVar6;
      } while (iVar3 < 0);
      if (iVar3 == 0) break;
      uVar11 = uVar6 + 1;
      uVar5 = uVar7;
    }
    uVar9 = uVar9 + uVar12;
    uVar11 = 0;
    if (uVar9 < slen) {
      uVar11 = (uint)string[uVar9];
    }
    bVar13 = (uVar11 | 0x20) - 0x7b < 0xffffffe6;
    bVar14 = uVar11 - 0x3a < 0xfffffff6;
    bVar8 = bVar14 && bVar13;
    if (uVar11 == 0x3b) {
LAB_00164538:
      local_88 = htmlEntStrings + uVar12 + uVar4 + 1;
      local_90 = (uVar11 == 0x3b) + uVar9;
      uVar5 = 2;
    }
    else if ((char)bVar1 < '\0') {
      if (isAttr == 0) goto LAB_00164538;
      if (uVar11 != 0x3d && (bVar14 && bVar13)) {
        local_88 = htmlEntStrings + uVar12 + uVar4 + 1;
        local_90 = uVar9;
      }
      uVar5 = (ulong)((uint)(uVar11 != 0x3d && bVar8) * 2);
    }
    else {
      uVar5 = 0;
    }
    if (((bVar1 & 0x40) == 0) || (local_88 = local_88 + uVar5, slen <= uVar9 || bVar8)) {
LAB_001645ce:
      if (local_88 == (byte *)0x0) {
        return (xmlChar *)0x0;
      }
      *nlen = (int)local_90;
      *rlen = (uint)*local_88;
      return local_88 + 1;
    }
    uVar11 = uVar6 + htmlEntStrings[uVar12 + uVar4 + 1];
    uVar6 = htmlEntStrings[uVar12 + uVar4 + 2] + uVar11;
  } while( true );
}

Assistant:

static const xmlChar *
htmlFindEntityPrefix(const xmlChar *string, size_t slen, int isAttr,
                     int *nlen, int *rlen) {
    const xmlChar *match = NULL;
    unsigned left, right;
    int first = string[0];
    size_t matchLen = 0;
    size_t soff = 1;

    if (slen < 2)
        return(NULL);
    if (!IS_ASCII_LETTER(first))
        return(NULL);

    /*
     * Look up range by first character
     */
    first &= 63;
    left = htmlEntAlpha[first*3] | htmlEntAlpha[first*3+1] << 8;
    right = left + htmlEntAlpha[first*3+2];

    /*
     * Binary search
     */
    while (left < right) {
        const xmlChar *bytes;
        unsigned mid;
        size_t len;
        int cmp;

        mid = left + (right - left) / 2;
        bytes = htmlEntStrings + htmlEntValues[mid];
        len = bytes[0] & ~ENT_F_ALL;

        cmp = string[soff] - bytes[1];

        if (cmp == 0) {
            if (slen < len) {
                cmp = strncmp((const char *) string + soff + 1,
                              (const char *) bytes + 2,
                              slen - 1);
                /* Prefix can never match */
                if (cmp == 0)
                    break;
            } else {
                cmp = strncmp((const char *) string + soff + 1,
                              (const char *) bytes + 2,
                              len - 1);
            }
        }

        if (cmp < 0) {
            right = mid;
        } else if (cmp > 0) {
            left = mid + 1;
        } else {
            int term = soff + len < slen ? string[soff + len] : 0;
            int isAlnum, isTerm;

            isAlnum = IS_ALNUM(term);
            isTerm = ((term == ';') ||
                      ((bytes[0] & ENT_F_SEMICOLON) &&
                       ((!isAttr) ||
                        ((!isAlnum) && (term != '=')))));

            if (isTerm) {
                match = bytes + len + 1;
                matchLen = soff + len;
                if (term == ';')
                    matchLen += 1;
            }

            if (bytes[0] & ENT_F_SUBTABLE) {
                if (isTerm)
                    match += 2;

                if ((isAlnum) && (soff + len < slen)) {
                    left = mid + bytes[len + 1];
                    right = left + bytes[len + 2];
                    soff += len;
                    continue;
                }
            }

            break;
        }
    }

    if (match == NULL)
        return(NULL);

    *nlen = matchLen;
    *rlen = match[0];
    return(match + 1);
}